

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O0

int copy_zip_file(FILE *zip,file_entry_t *file,FILE *ozip,CentralDirectoryEntry *ent)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  char *__s1;
  long lVar4;
  UINT32 buf_size;
  BYTE *buf;
  short local_48;
  LocalFileHeader lfh;
  CentralDirectoryEntry *ent_local;
  FILE *ozip_local;
  file_entry_t *file_local;
  FILE *zip_local;
  
  lfh._22_8_ = ent;
  iVar1 = fseek((FILE *)ozip,(ulong)ent->LocalHeaderOffset,0);
  if (iVar1 == 0) {
    sVar3 = fread((void *)((long)&buf + 2),0x1e,1,(FILE *)ozip);
    if (sVar3 == 1) {
      if (((((local_48 == *(short *)(lfh._22_8_ + 8)) &&
            ((short)lfh.Magic == *(short *)(lfh._22_8_ + 10))) &&
           (lfh._6_4_ == *(int *)(lfh._22_8_ + 0x10))) &&
          ((lfh._10_4_ == *(int *)(lfh._22_8_ + 0x14) &&
           (lfh.CRC32 == *(UINT32 *)(lfh._22_8_ + 0x18))))) &&
         (((ushort)lfh.CompressedSize == *(ushort *)(lfh._22_8_ + 0x1c) &&
          (lfh.CompressedSize._2_2_ == *(short *)(lfh._22_8_ + 0x1e))))) {
        uVar2 = (uint)(ushort)lfh.CompressedSize + lfh._10_4_;
        __s1 = (char *)malloc((ulong)uVar2);
        if (__s1 == (char *)0x0) {
          zip_local._4_4_ = 0;
        }
        else {
          sVar3 = fread(__s1,1,(ulong)uVar2,(FILE *)ozip);
          if (sVar3 == uVar2) {
            iVar1 = strncmp(__s1,(char *)(lfh._22_8_ + 0x2e),(ulong)(ushort)lfh.CompressedSize);
            if (iVar1 == 0) {
              lVar4 = ftell((FILE *)zip);
              file->zip_offset = (uint)lVar4;
              sVar3 = fwrite((void *)((long)&buf + 2),0x1e,1,(FILE *)zip);
              if ((sVar3 == 1) && (sVar3 = fwrite(__s1,1,(ulong)uVar2,(FILE *)zip), sVar3 == uVar2))
              {
                free(__s1);
                file->date = (short)lfh.VersionToExtract;
                file->time = lfh.Magic._2_2_;
                file->uncompressed_size = lfh.CRC32;
                file->compressed_size = lfh._10_4_;
                file->method = (short)lfh.Magic;
                file->crc32 = lfh._6_4_;
                return 1;
              }
              free(__s1);
              zip_local._4_4_ = -1;
            }
            else {
              free(__s1);
              zip_local._4_4_ = 0;
            }
          }
          else {
            free(__s1);
            zip_local._4_4_ = 0;
          }
        }
      }
      else {
        zip_local._4_4_ = 0;
      }
    }
    else {
      zip_local._4_4_ = 0;
    }
  }
  else {
    zip_local._4_4_ = 0;
  }
  return zip_local._4_4_;
}

Assistant:

int copy_zip_file(FILE *zip, file_entry_t *file, FILE *ozip, CentralDirectoryEntry *ent)
{
	LocalFileHeader lfh;
	BYTE *buf;
	UINT32 buf_size;

	if (fseek(ozip, LittleLong(ent->LocalHeaderOffset), SEEK_SET) != 0)
	{
		return 0;
	}
	if (fread(&lfh, sizeof(lfh), 1, ozip) != 1)
	{
		return 0;
	}
	// Check to make sure the local header matches the central directory.
	if (lfh.Flags != ent->Flags || lfh.Method != ent->Method ||
		lfh.CRC32 != ent->CRC32 || lfh.CompressedSize != ent->CompressedSize ||
		lfh.UncompressedSize != ent->UncompressedSize ||
		lfh.NameLength != ent->NameLength || lfh.ExtraLength != ent->ExtraLength)
	{
		return 0;
	}
	buf_size = LittleShort(lfh.NameLength) + LittleLong(lfh.CompressedSize);
	buf = malloc(buf_size);
	if (buf == NULL)
	{
		return 0;
	}
	if (fread(buf, 1, buf_size, ozip) != buf_size)
	{
		free(buf);
		return 0;
	}
	// Check to be sure name matches.
	if (strncmp((char *)buf, (char *)(ent + 1), LittleShort(lfh.NameLength)) != 0)
	{
		free(buf);
		return 0;
	}
	// Looks good. Let's write it in.
	file->zip_offset = ftell(zip);
	if (fwrite(&lfh, sizeof(lfh), 1, zip) != 1 ||
		fwrite(buf, 1, buf_size, zip) != buf_size)
	{
		free(buf);
		return -1;
	}
	free(buf);
	file->date = lfh.ModDate;
	file->time = lfh.ModTime;
	file->uncompressed_size = LittleLong(lfh.UncompressedSize);
	file->compressed_size = LittleLong(lfh.CompressedSize);
	file->method = LittleShort(lfh.Method);
	file->crc32 = lfh.CRC32;
	return 1;
}